

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O2

ComparisonResult __thiscall
google::protobuf::util::SimpleFieldComparator::SimpleCompare
          (SimpleFieldComparator *this,Message *message_1,Message *message_2,FieldDescriptor *field,
          int index_1,int index_2,FieldContext *param_6)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  __type_conflict _Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  EnumValueDescriptor *pEVar9;
  EnumValueDescriptor *pEVar10;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  LogMessage *pLVar11;
  Reflection *this_00;
  Reflection *this_01;
  undefined4 uVar12;
  float value_1;
  float value_2;
  double value_1_00;
  double dVar13;
  undefined4 uVar14;
  Metadata MVar15;
  string scratch1;
  string scratch2;
  
  MVar15 = Message::GetMetadata(message_1);
  this_00 = MVar15.reflection;
  MVar15 = Message::GetMetadata(message_2);
  this_01 = MVar15.reflection;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      uVar5 = Reflection::GetRepeatedInt32(this_00,message_1,field,index_1);
      uVar6 = Reflection::GetRepeatedInt32(this_01,message_2,field,index_2);
    }
    else {
      uVar5 = Reflection::GetInt32(this_00,message_1,field);
      uVar6 = Reflection::GetInt32(this_01,message_2,field);
    }
    break;
  case 2:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      uVar7 = Reflection::GetRepeatedInt64(this_00,message_1,field,index_1);
      uVar8 = Reflection::GetRepeatedInt64(this_01,message_2,field,index_2);
    }
    else {
      uVar7 = Reflection::GetInt64(this_00,message_1,field);
      uVar8 = Reflection::GetInt64(this_01,message_2,field);
    }
    goto LAB_002d3bbd;
  case 3:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      uVar5 = Reflection::GetRepeatedUInt32(this_00,message_1,field,index_1);
      uVar6 = Reflection::GetRepeatedUInt32(this_01,message_2,field,index_2);
    }
    else {
      uVar5 = Reflection::GetUInt32(this_00,message_1,field);
      uVar6 = Reflection::GetUInt32(this_01,message_2,field);
    }
    break;
  case 4:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      uVar7 = Reflection::GetRepeatedUInt64(this_00,message_1,field,index_1);
      uVar8 = Reflection::GetRepeatedUInt64(this_01,message_2,field,index_2);
    }
    else {
      uVar7 = Reflection::GetUInt64(this_00,message_1,field);
      uVar8 = Reflection::GetUInt64(this_01,message_2,field);
    }
LAB_002d3bbd:
    bVar2 = uVar7 == uVar8;
    goto LAB_002d3bc2;
  case 5:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      value_1_00 = Reflection::GetRepeatedDouble(this_00,message_1,field,index_1);
      dVar13 = Reflection::GetRepeatedDouble(this_01,message_2,field,index_2);
      uVar12 = SUB84(dVar13,0);
      uVar14 = (undefined4)((ulong)dVar13 >> 0x20);
    }
    else {
      value_1_00 = Reflection::GetDouble(this_00,message_1,field);
      dVar13 = Reflection::GetDouble(this_01,message_2,field);
      uVar12 = SUB84(dVar13,0);
      uVar14 = (undefined4)((ulong)dVar13 >> 0x20);
    }
    bVar2 = CompareDoubleOrFloat<double>(this,field,value_1_00,(double)CONCAT44(uVar14,uVar12));
    goto LAB_002d3bf7;
  case 6:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      value_1 = Reflection::GetRepeatedFloat(this_00,message_1,field,index_1);
      value_2 = Reflection::GetRepeatedFloat(this_01,message_2,field,index_2);
    }
    else {
      value_1 = Reflection::GetFloat(this_00,message_1,field);
      value_2 = Reflection::GetFloat(this_01,message_2,field);
    }
    bVar2 = CompareDoubleOrFloat<float>(this,field,value_1,value_2);
LAB_002d3bf7:
    bVar3 = bVar2 ^ 1;
LAB_002d3c13:
    return (uint)bVar3;
  case 7:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      bVar2 = Reflection::GetRepeatedBool(this_00,message_1,field,index_1);
      bVar1 = Reflection::GetRepeatedBool(this_01,message_2,field,index_2);
    }
    else {
      bVar2 = Reflection::GetBool(this_00,message_1,field);
      bVar1 = Reflection::GetBool(this_01,message_2,field);
    }
    bVar3 = bVar1 ^ bVar2;
    goto LAB_002d3c13;
  case 8:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      pEVar9 = Reflection::GetRepeatedEnum(this_00,message_1,field,index_1);
      pEVar10 = Reflection::GetRepeatedEnum(this_01,message_2,field,index_2);
    }
    else {
      pEVar9 = Reflection::GetEnum(this_00,message_1,field);
      pEVar10 = Reflection::GetEnum(this_01,message_2,field);
    }
    bVar2 = pEVar9->number_ == pEVar10->number_;
    goto LAB_002d3bc2;
  case 9:
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      scratch1._M_dataplus._M_p = (pointer)&scratch1.field_2;
      scratch1._M_string_length = 0;
      scratch1.field_2._M_local_buf[0] = '\0';
      scratch2._M_dataplus._M_p = (pointer)&scratch2.field_2;
      scratch2._M_string_length = 0;
      scratch2.field_2._M_local_buf[0] = '\0';
      __lhs = Reflection::GetRepeatedStringReference(this_00,message_1,field,index_1,&scratch1);
      __rhs = Reflection::GetRepeatedStringReference(this_01,message_2,field,index_2,&scratch2);
    }
    else {
      scratch1._M_dataplus._M_p = (pointer)&scratch1.field_2;
      scratch1._M_string_length = 0;
      scratch1.field_2._M_local_buf[0] = '\0';
      scratch2._M_dataplus._M_p = (pointer)&scratch2.field_2;
      scratch2._M_string_length = 0;
      scratch2.field_2._M_local_buf[0] = '\0';
      __lhs = Reflection::GetStringReference(this_00,message_1,field,&scratch1);
      __rhs = Reflection::GetStringReference(this_01,message_2,field,&scratch2);
    }
    _Var4 = std::operator==(__lhs,__rhs);
    std::__cxx11::string::~string((string *)&scratch2);
    std::__cxx11::string::~string((string *)&scratch1);
    return (uint)!_Var4;
  case 10:
    return RECURSE;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&scratch1,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/field_comparator.cc"
               ,0x84);
    pLVar11 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        ((LogMessage *)&scratch1,(char (*) [30])"No comparison code for field ");
    pLVar11 = (LogMessage *)
              absl::lts_20240722::log_internal::LogMessage::operator<<
                        (pLVar11,(string *)(field->all_names_ + 1));
    pLVar11 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        (pLVar11,(char (*) [15])" of CppType = ");
    scratch2._M_dataplus._M_p._0_4_ =
         *(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
    absl::lts_20240722::log_internal::LogMessage::
    operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
              (pLVar11,(CppType *)&scratch2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&scratch1);
  }
  bVar2 = uVar5 == uVar6;
LAB_002d3bc2:
  return (uint)!bVar2;
}

Assistant:

FieldComparator::ComparisonResult SimpleFieldComparator::SimpleCompare(
    const Message& message_1, const Message& message_2,
    const FieldDescriptor* field, int index_1, int index_2,
    const util::FieldContext* /*field_context*/) {
  const Reflection* reflection_1 = message_1.GetReflection();
  const Reflection* reflection_2 = message_2.GetReflection();

  switch (field->cpp_type()) {
#define COMPARE_FIELD(METHOD)                                                 \
  if (field->is_repeated()) {                                                 \
    return ResultFromBoolean(Compare##METHOD(                                 \
        *field, reflection_1->GetRepeated##METHOD(message_1, field, index_1), \
        reflection_2->GetRepeated##METHOD(message_2, field, index_2)));       \
  } else {                                                                    \
    return ResultFromBoolean(                                                 \
        Compare##METHOD(*field, reflection_1->Get##METHOD(message_1, field),  \
                        reflection_2->Get##METHOD(message_2, field)));        \
  }                                                                           \
  break;  // Make sure no fall-through is introduced.

    case FieldDescriptor::CPPTYPE_BOOL:
      COMPARE_FIELD(Bool);
    case FieldDescriptor::CPPTYPE_DOUBLE:
      COMPARE_FIELD(Double);
    case FieldDescriptor::CPPTYPE_ENUM:
      COMPARE_FIELD(Enum);
    case FieldDescriptor::CPPTYPE_FLOAT:
      COMPARE_FIELD(Float);
    case FieldDescriptor::CPPTYPE_INT32:
      COMPARE_FIELD(Int32);
    case FieldDescriptor::CPPTYPE_INT64:
      COMPARE_FIELD(Int64);
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->is_repeated()) {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(
            CompareString(*field,
                          reflection_1->GetRepeatedStringReference(
                              message_1, field, index_1, &scratch1),
                          reflection_2->GetRepeatedStringReference(
                              message_2, field, index_2, &scratch2)));
      } else {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(CompareString(
            *field,
            reflection_1->GetStringReference(message_1, field, &scratch1),
            reflection_2->GetStringReference(message_2, field, &scratch2)));
      }
      break;
    case FieldDescriptor::CPPTYPE_UINT32:
      COMPARE_FIELD(UInt32);
    case FieldDescriptor::CPPTYPE_UINT64:
      COMPARE_FIELD(UInt64);

#undef COMPARE_FIELD

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return RECURSE;

    default:
      ABSL_LOG(FATAL) << "No comparison code for field " << field->full_name()
                      << " of CppType = " << field->cpp_type();
      return DIFFERENT;
  }
}